

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_YAFluxRegister.cpp
# Opt level: O2

void __thiscall
amrex::YAFluxRegister::FineAdd
          (YAFluxRegister *this,MFIter *mfi,array<const_amrex::FArrayBox_*,_3UL> *a_flux,Real *dx,
          Real dt,RunOn runon)

{
  Box *rhs;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pVVar7;
  FArrayBox *pFVar8;
  FArrayBox *pFVar9;
  double *pdVar10;
  double *pdVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  bool bVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int *piVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  pointer ppFVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int koff_1;
  long lVar46;
  ulong uVar47;
  int iVar48;
  int koff;
  ulong uVar49;
  ulong uVar50;
  BaseFab<double> *this_00;
  undefined1 auVar51 [16];
  IntVect IVar52;
  uint local_318;
  Box bx;
  Box result;
  Box result_1;
  IntVect hi_1;
  IntVect hi;
  int iStack_1cc;
  int iStack_1c8;
  Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *__range2;
  double local_1b0;
  int iStack_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  double *local_198;
  double *local_190;
  pointer local_188;
  pointer local_180;
  int local_178 [3];
  FArrayBox *local_168 [4];
  undefined1 local_148 [16];
  double local_138;
  Box local_124;
  array<amrex::FArrayBox,_3UL> ftmp;
  
  piVar19 = &mfi->currentIndex;
  if (mfi->local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar19 = (mfi->local_index_map->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              + *piVar19;
  }
  iVar1 = *piVar19;
  pVVar7 = (this->m_cfp_fab).
           super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       &pVVar7[iVar1].super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
        super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> ==
      *(pointer *)
       ((long)&pVVar7[iVar1].super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> + 8)) {
    return;
  }
  MFIter::tilebox(&local_124,mfi);
  result.bigend.vect[1] = local_124.bigend.vect[1];
  result.bigend.vect[2] = local_124.bigend.vect[2];
  result.btype.itype = local_124.btype.itype;
  result.smallend.vect[0] = local_124.smallend.vect[0];
  result.smallend.vect[1] = local_124.smallend.vect[1];
  uVar14 = result.smallend.vect._0_8_;
  result.smallend.vect[2] = local_124.smallend.vect[2];
  result.bigend.vect[0] = local_124.bigend.vect[0];
  uVar2 = (this->m_ratio).vect[0];
  uVar3 = (this->m_ratio).vect[1];
  local_318 = 1;
  result.smallend.vect[1] = local_124.smallend.vect[1];
  result_1.smallend.vect[1] = result.smallend.vect[1];
  if (uVar3 == 1 && uVar2 == 1) {
    result.smallend.vect._0_8_ = uVar14;
    if ((this->m_ratio).vect[2] == 1) {
      result_1.bigend.vect[1] = local_124.bigend.vect[1];
      result_1.bigend.vect[2] = local_124.bigend.vect[2];
      result_1.btype.itype = local_124.btype.itype;
      result_1.smallend.vect[0] = local_124.smallend.vect[0];
      result_1.smallend.vect[1] = local_124.smallend.vect[1];
      result_1.smallend.vect[2] = local_124.smallend.vect[2];
      result_1.bigend.vect[0] = local_124.bigend.vect[0];
      goto LAB_006d03dc;
    }
  }
  else {
    result.smallend.vect[0] = local_124.smallend.vect[0];
    if (uVar2 != 1) {
      if (uVar2 == 4) {
        if (result.smallend.vect[0] < 0) {
          result.smallend.vect[0] = result.smallend.vect[0] >> 2;
        }
        else {
          result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
        }
      }
      else if (uVar2 == 2) {
        if (result.smallend.vect[0] < 0) {
          result.smallend.vect[0] = result.smallend.vect[0] >> 1;
        }
        else {
          result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
        }
      }
      else if (result.smallend.vect[0] < 0) {
        result.smallend.vect[0] = ~(~result.smallend.vect[0] / (int)uVar2);
      }
      else {
        result.smallend.vect[0] = result.smallend.vect[0] / (int)uVar2;
      }
    }
    if (uVar3 != 1) {
      if (uVar3 == 4) {
        if ((long)local_124.smallend.vect._0_8_ < 0) {
          result_1.smallend.vect[1] = result.smallend.vect[1] >> 2;
        }
        else {
          result_1.smallend.vect[1] = (uint)result.smallend.vect[1] >> 2;
        }
      }
      else if (uVar3 == 2) {
        if ((long)local_124.smallend.vect._0_8_ < 0) {
          result_1.smallend.vect[1] = result.smallend.vect[1] >> 1;
        }
        else {
          result_1.smallend.vect[1] = (uint)result.smallend.vect[1] >> 1;
        }
      }
      else if ((long)local_124.smallend.vect._0_8_ < 0) {
        result_1.smallend.vect[1] = ~(~result.smallend.vect[1] / (int)uVar3);
      }
      else {
        result_1.smallend.vect[1] = result.smallend.vect[1] / (int)uVar3;
      }
    }
  }
  result.smallend.vect[1] = result_1.smallend.vect[1];
  uVar18 = (this->m_ratio).vect[2];
  if (uVar18 != 1) {
    if (uVar18 == 4) {
      if (local_124.smallend.vect[2] < 0) {
        local_124.smallend.vect[2] = local_124.smallend.vect[2] >> 2;
      }
      else {
        local_124.smallend.vect[2] = (uint)local_124.smallend.vect[2] >> 2;
      }
    }
    else if (uVar18 == 2) {
      if (local_124.smallend.vect[2] < 0) {
        local_124.smallend.vect[2] = local_124.smallend.vect[2] >> 1;
      }
      else {
        local_124.smallend.vect[2] = (uint)local_124.smallend.vect[2] >> 1;
      }
    }
    else if (local_124.smallend.vect[2] < 0) {
      local_124.smallend.vect[2] = ~(~local_124.smallend.vect[2] / (int)uVar18);
    }
    else {
      local_124.smallend.vect[2] = local_124.smallend.vect[2] / (int)uVar18;
    }
  }
  result.smallend.vect[2] = local_124.smallend.vect[2];
  result.btype.itype = local_124.btype.itype;
  result.bigend.vect[2] = local_124.bigend.vect[2];
  if (result.btype.itype == 0) {
    if (uVar2 != 1) {
      if (uVar2 == 4) {
        result.bigend.vect[0] = local_124.bigend.vect[0] >> 2;
        if (-1 < local_124.bigend.vect[0]) {
          result.bigend.vect[0] = (uint)local_124.bigend.vect[0] >> 2;
        }
      }
      else if (uVar2 == 2) {
        result.bigend.vect[0] = local_124.bigend.vect[0] >> 1;
        if (-1 < local_124.bigend.vect[0]) {
          result.bigend.vect[0] = (uint)local_124.bigend.vect[0] >> 1;
        }
      }
      else if (local_124.bigend.vect[0] < 0) {
        result.bigend.vect[0] = ~(~local_124.bigend.vect[0] / (int)uVar2);
      }
      else {
        result.bigend.vect[0] = local_124.bigend.vect[0] / (int)uVar2;
      }
    }
    if (uVar3 != 1) {
      if (uVar3 == 4) {
        result.bigend.vect[1] = local_124.bigend.vect[1] >> 2;
        if (-1 < local_124.bigend.vect[1]) {
          result.bigend.vect[1] = (uint)local_124.bigend.vect[1] >> 2;
        }
      }
      else if (uVar3 == 2) {
        result.bigend.vect[1] = local_124.bigend.vect[1] >> 1;
        if (-1 < local_124.bigend.vect[1]) {
          result.bigend.vect[1] = (uint)local_124.bigend.vect[1] >> 1;
        }
      }
      else if (local_124.bigend.vect[1] < 0) {
        result.bigend.vect[1] = ~(~local_124.bigend.vect[1] / (int)uVar3);
      }
      else {
        result.bigend.vect[1] = local_124.bigend.vect[1] / (int)uVar3;
      }
    }
    result_1.bigend.vect[2] = result.bigend.vect[2];
    if (uVar18 != 1) {
      if (uVar18 == 4) {
        result_1.bigend.vect[2] = result.bigend.vect[2] >> 2;
        if (-1 < result.bigend.vect[2]) {
          result_1.bigend.vect[2] = (uint)result.bigend.vect[2] >> 2;
        }
      }
      else if (uVar18 == 2) {
        result_1.bigend.vect[2] = result.bigend.vect[2] >> 1;
        if (-1 < result.bigend.vect[2]) {
          result_1.bigend.vect[2] = (uint)result.bigend.vect[2] >> 1;
        }
      }
      else if (result.bigend.vect[2] < 0) {
        result_1.bigend.vect[2] = ~(~result.bigend.vect[2] / (int)uVar18);
      }
      else {
        result_1.bigend.vect[2] = result.bigend.vect[2] / (int)uVar18;
      }
    }
  }
  else {
    ftmp._M_elems[0].super_BaseFab<double>._vptr_BaseFab = (_func_int **)0x0;
    ftmp._M_elems[0].super_BaseFab<double>.super_DataAllocator.m_arena._0_4_ = 0;
    for (lVar35 = 0; lVar35 != 3; lVar35 = lVar35 + 1) {
      if (((result.btype.itype >> ((uint)lVar35 & 0x1f) & 1) != 0) &&
         (result.bigend.vect[lVar35] % (this->m_ratio).vect[lVar35] != 0)) {
        *(undefined4 *)
         ((long)(&ftmp._M_elems[0].super_BaseFab<double>.domain.smallend + -2) + lVar35 * 4) = 1;
      }
    }
    uVar21 = local_124.bigend.vect[0];
    if (uVar2 != 1) {
      if (uVar2 == 4) {
        uVar21 = local_124.bigend.vect[0] >> 2;
        if (-1 < local_124.bigend.vect[0]) {
          uVar21 = (uint)local_124.bigend.vect[0] >> 2;
        }
      }
      else if (uVar2 == 2) {
        uVar21 = local_124.bigend.vect[0] >> 1;
        if (-1 < local_124.bigend.vect[0]) {
          uVar21 = (uint)local_124.bigend.vect[0] >> 1;
        }
      }
      else if (local_124.bigend.vect[0] < 0) {
        uVar21 = ~(~local_124.bigend.vect[0] / (int)uVar2);
      }
      else {
        uVar21 = local_124.bigend.vect[0] / (int)uVar2;
      }
    }
    uVar30 = local_124.bigend.vect[1];
    if (uVar3 != 1) {
      if (uVar3 == 4) {
        uVar30 = local_124.bigend.vect[1] >> 2;
        if (-1 < local_124.bigend.vect[1]) {
          uVar30 = (uint)local_124.bigend.vect[1] >> 2;
        }
      }
      else if (uVar3 == 2) {
        uVar30 = local_124.bigend.vect[1] >> 1;
        if (-1 < local_124.bigend.vect[1]) {
          uVar30 = (uint)local_124.bigend.vect[1] >> 1;
        }
      }
      else if (local_124.bigend.vect[1] < 0) {
        uVar30 = ~(~local_124.bigend.vect[1] / (int)uVar3);
      }
      else {
        uVar30 = local_124.bigend.vect[1] / (int)uVar3;
      }
    }
    uVar16 = result.bigend.vect[2];
    if (uVar18 != 1) {
      if (uVar18 == 4) {
        uVar16 = result.bigend.vect[2] >> 2;
        if (-1 < result.bigend.vect[2]) {
          uVar16 = (uint)result.bigend.vect[2] >> 2;
        }
      }
      else if (uVar18 == 2) {
        uVar16 = result.bigend.vect[2] >> 1;
        if (-1 < result.bigend.vect[2]) {
          uVar16 = (uint)result.bigend.vect[2] >> 1;
        }
      }
      else if (result.bigend.vect[2] < 0) {
        uVar16 = ~(~result.bigend.vect[2] / (int)uVar18);
      }
      else {
        uVar16 = result.bigend.vect[2] / (int)uVar18;
      }
    }
    result.bigend.vect[0] = uVar21 + (int)ftmp._M_elems[0].super_BaseFab<double>._vptr_BaseFab;
    result.bigend.vect[1] = uVar30 + ftmp._M_elems[0].super_BaseFab<double>._vptr_BaseFab._4_4_;
    result_1.bigend.vect[2] =
         uVar16 + (int)ftmp._M_elems[0].super_BaseFab<double>.super_DataAllocator.m_arena;
  }
  local_318 = 1;
  result.bigend.vect[2] = result_1.bigend.vect[2];
  result_1.bigend.vect[1] = result.bigend.vect[1];
  result_1.btype.itype = result.btype.itype;
  result_1.smallend.vect[0] = result.smallend.vect[0];
  result_1.bigend.vect[0] = result.bigend.vect[0];
  result_1.smallend.vect[2] = local_124.smallend.vect[2];
  if (!(bool)(~(uVar3 != 1 || uVar2 != 1) & uVar18 == 1)) {
    uVar21 = (uint)((local_124._20_8_ & 0x200000000) == 0);
    result_1.smallend.vect[1] = result_1.smallend.vect[1] * uVar3;
    result_1.smallend.vect[0] = result.smallend.vect[0] * uVar2;
    result_1.smallend.vect[2] = local_124.smallend.vect[2] * uVar18;
    uVar30 = (uint)((local_124._20_8_ & 0x400000000) == 0);
    result_1.bigend.vect[0] =
         (result.bigend.vect[0] + (~result.btype.itype & 1)) * uVar2 - (~result.btype.itype & 1);
    result_1.bigend.vect[1] = (result.bigend.vect[1] + uVar21) * uVar3 - uVar21;
    result_1.bigend.vect[2] = (result_1.bigend.vect[2] + uVar30) * uVar18 - uVar30;
    local_318 = uVar18;
  }
LAB_006d03dc:
  uVar18 = (this->m_cfpatch).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp;
  dVar12 = (double)(int)(uVar3 * uVar2 * local_318);
  auVar51._8_8_ = dt;
  auVar51._0_8_ = dt;
  auVar13._8_8_ = dVar12 * dx[1];
  auVar13._0_8_ = dVar12 * *dx;
  local_148 = divpd(auVar51,auVar13);
  local_138 = dt / (dVar12 * dx[2]);
  local_168[0] = a_flux->_M_elems[0];
  local_168[1] = a_flux->_M_elems[1];
  local_168[2] = a_flux->_M_elems[2];
  this_00 = (BaseFab<double> *)&ftmp;
  std::array<amrex::FArrayBox,_3UL>::array((array<amrex::FArrayBox,_3UL> *)this_00);
  bVar15 = Box::operator!=(&result_1,&local_124);
  if (bVar15) {
    for (lVar35 = -3; lVar35 != 0; lVar35 = lVar35 + 1) {
      bx.bigend.vect[1] = result_1.bigend.vect[1];
      bx.bigend.vect[2] = result_1.bigend.vect[2];
      bx.btype.itype = result_1.btype.itype;
      uVar21 = (int)lVar35 + 3;
      bx.smallend.vect[0] = result_1.smallend.vect[0];
      bx.smallend.vect[1] = result_1.smallend.vect[1];
      bx.smallend.vect[2] = result_1.smallend.vect[2];
      bx.bigend.vect[0] = result_1.bigend.vect[0];
      if ((bx.btype.itype >> (uVar21 & 0x1f) & 1) == 0) {
        ((IndexType *)(&bx.bigend + 1))[lVar35].itype =
             ((IndexType *)(&bx.bigend + 1))[lVar35].itype + 1;
        bx.btype.itype = bx.btype.itype | 1 << ((byte)uVar21 & 0x1f);
      }
      FArrayBox::resize((FArrayBox *)this_00,&bx,uVar18,(Arena *)0x0);
      local_1b0 = 0.0;
      BaseFab<double>::setVal<(amrex::RunOn)1>(this_00,&local_1b0);
      BaseFab<double>::copy<(amrex::RunOn)1>
                (this_00,&a_flux[1]._M_elems[lVar35]->super_BaseFab<double>);
      local_168[lVar35 + 3] = (FArrayBox *)this_00;
      this_00 = this_00 + 1;
    }
  }
  uVar31 = 0;
  uVar23 = 0;
  if (0 < (int)uVar2) {
    uVar23 = (ulong)uVar2;
  }
  uVar24 = 0;
  if (0 < (int)local_318) {
    uVar24 = (ulong)local_318;
  }
  uVar49 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar49 = uVar31;
  }
  uVar47 = 0;
  if (0 < (int)uVar3) {
    uVar47 = (ulong)uVar3;
  }
  for (; uVar31 != 3; uVar31 = uVar31 + 1) {
    bx.smallend.vect[2] = result.smallend.vect[2];
    bx.smallend.vect[0] = result.smallend.vect[0];
    bx.smallend.vect[1] = result.smallend.vect[1];
    hi.vect[2] = result.bigend.vect[2];
    hi.vect[0] = result.bigend.vect[0];
    hi.vect[1] = result.bigend.vect[1];
    iVar17 = bx.smallend.vect[uVar31] + -1;
    bx.smallend.vect[uVar31] = iVar17;
    hi.vect[uVar31] = iVar17;
    uVar30 = (uint)uVar31;
    uVar18 = result.btype.itype & ~(1 << (uVar30 & 0x1f));
    local_1b0 = (double)bx.smallend.vect._0_8_;
    iStack_1a8 = bx.smallend.vect[2];
    iStack_1a4 = hi.vect[0];
    iStack_1a0 = hi.vect[1];
    iStack_19c = hi.vect[2];
    bx.smallend.vect[2] = result.smallend.vect[2];
    bx.smallend.vect[0] = result.smallend.vect[0];
    bx.smallend.vect[1] = result.smallend.vect[1];
    hi_1.vect[2] = result.bigend.vect[2];
    hi_1.vect[1] = result.bigend.vect[1];
    hi_1.vect[0] = result.bigend.vect[0];
    IVar52 = Box::type(&result);
    local_178[0] = IVar52.vect[0];
    local_178[1] = IVar52.vect[1];
    local_178[2] = IVar52.vect[2];
    iVar17 = (~local_178[uVar31] & 1U) + hi_1.vect[uVar31];
    bx.smallend.vect[uVar31] = iVar17;
    hi_1.vect[uVar31] = iVar17;
    iVar17 = hi_1.vect[2];
    uVar21 = result.btype.itype & ~(1 << (uVar30 & 0x1f));
    hi.vect[0] = bx.smallend.vect[0];
    hi.vect[1] = bx.smallend.vect[1];
    hi.vect[2] = bx.smallend.vect[2];
    iStack_1cc = hi_1.vect[0];
    iStack_1c8 = hi_1.vect[1];
    pFVar8 = local_168[uVar31];
    ppFVar25 = *(pointer *)
                &pVVar7[iVar1].super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                 .super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>;
    local_188 = *(pointer *)
                 ((long)&pVVar7[iVar1].
                         super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                         super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                 + 8);
    while (ppFVar25 != local_188) {
      pFVar9 = *ppFVar25;
      rhs = &(pFVar9->super_BaseFab<double>).domain;
      bx.bigend.vect[1] = iStack_1a0;
      bx.bigend.vect[2] = iStack_19c;
      bx.smallend.vect._0_8_ = local_1b0;
      bx.smallend.vect[2] = iStack_1a8;
      bx.bigend.vect[0] = iStack_1a4;
      bx.btype.itype = uVar18;
      local_180 = ppFVar25;
      Box::operator&=(&bx,rhs);
      lVar37 = (long)bx.bigend.vect[0];
      lVar35 = (long)bx.smallend.vect[0];
      if (bx.smallend.vect[0] <= bx.bigend.vect[0]) {
        lVar26 = (long)bx.bigend.vect[1];
        lVar20 = (long)bx.smallend.vect[1];
        if (bx.smallend.vect[1] <= bx.bigend.vect[1]) {
          if ((bx.smallend.vect[2] <= bx.bigend.vect[2]) && (bx.btype.itype < 8)) {
            pdVar10 = (pFVar9->super_BaseFab<double>).dptr;
            iVar33 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[0];
            lVar43 = (long)iVar33;
            iVar39 = *(int *)((long)&(pFVar9->super_BaseFab<double>).domain + 4);
            lVar46 = (long)iVar39;
            iVar22 = *(int *)((long)&(pFVar9->super_BaseFab<double>).domain + 8);
            lVar44 = (long)((((IntVect *)((long)&(pFVar9->super_BaseFab<double>).domain + 0xc))->
                             vect[0] - iVar33) + 1);
            lVar28 = ((*(int *)((long)&(pFVar9->super_BaseFab<double>).domain + 0x10) - iVar39) + 1)
                     * lVar44;
            lVar45 = ((*(int *)((long)&(pFVar9->super_BaseFab<double>).domain + 0x14) - iVar22) + 1)
                     * lVar28;
            dVar12 = *(double *)(local_148 + uVar31 * 8);
            pdVar11 = (pFVar8->super_BaseFab<double>).dptr;
            iVar4 = (pFVar8->super_BaseFab<double>).domain.smallend.vect[0];
            iVar5 = (pFVar8->super_BaseFab<double>).domain.smallend.vect[1];
            iVar6 = (pFVar8->super_BaseFab<double>).domain.smallend.vect[2];
            lVar41 = (long)(((pFVar8->super_BaseFab<double>).domain.bigend.vect[0] - iVar4) + 1);
            lVar27 = (((pFVar8->super_BaseFab<double>).domain.bigend.vect[1] - iVar5) + 1) * lVar41;
            lVar40 = (((pFVar8->super_BaseFab<double>).domain.bigend.vect[2] - iVar6) + 1) * lVar27;
            if (uVar30 == 0) {
              local_190 = pdVar10 + (bx.smallend.vect[0] - iVar33);
              local_198 = pdVar11 + (int)((bx.smallend.vect[0] + 1) * uVar2 - iVar4);
              for (uVar38 = 0; uVar38 != uVar49; uVar38 = uVar38 + 1) {
                for (lVar35 = (long)bx.smallend.vect[2]; lVar35 <= bx.bigend.vect[2];
                    lVar35 = lVar35 + 1) {
                  lVar43 = (lVar35 - iVar22) * lVar28;
                  iVar33 = uVar3 * bx.smallend.vect[1] - iVar5;
                  for (lVar37 = lVar20; lVar37 <= lVar26; lVar37 = lVar37 + 1) {
                    lVar42 = (lVar37 - lVar46) * lVar44;
                    for (uVar50 = 0; uVar50 != uVar24; uVar50 = uVar50 + 1) {
                      uVar32 = uVar47;
                      iVar39 = iVar33;
                      while (bVar15 = uVar32 != 0, uVar32 = uVar32 - 1, bVar15) {
                        local_190[lVar45 * uVar38 + lVar43 + lVar42] =
                             local_190[lVar45 * uVar38 + lVar43 + lVar42] -
                             local_198[lVar40 * uVar38 +
                                       (int)((local_318 * (int)lVar35 - iVar6) + (int)uVar50) *
                                       lVar27 + iVar39 * lVar41] * dVar12;
                        iVar39 = iVar39 + 1;
                      }
                    }
                    iVar33 = iVar33 + uVar3;
                  }
                }
              }
            }
            else if (uVar30 == 2) {
              lVar28 = lVar28 * (bx.smallend.vect[2] - iVar22);
              for (uVar38 = 0; uVar38 != uVar49; uVar38 = uVar38 + 1) {
                for (lVar42 = lVar20; lVar42 <= lVar26; lVar42 = lVar42 + 1) {
                  lVar29 = (lVar42 - lVar46) * lVar44;
                  iVar33 = uVar2 * bx.smallend.vect[0] - iVar4;
                  for (lVar36 = lVar35; lVar36 <= lVar37; lVar36 = lVar36 + 1) {
                    for (uVar50 = 0; uVar50 != uVar47; uVar50 = uVar50 + 1) {
                      uVar32 = uVar23;
                      iVar39 = iVar33;
                      while (bVar15 = uVar32 != 0, uVar32 = uVar32 - 1, bVar15) {
                        pdVar10[lVar28 + lVar45 * uVar38 + lVar29 + (lVar36 - lVar43)] =
                             pdVar10[lVar28 + lVar45 * uVar38 + lVar29 + (lVar36 - lVar43)] -
                             pdVar11[lVar27 * (int)((bx.smallend.vect[2] + 1) * local_318 - iVar6) +
                                     lVar40 * uVar38 +
                                     (int)((uVar3 * (int)lVar42 - iVar5) + (int)uVar50) * lVar41 +
                                     (long)iVar39] * dVar12;
                        iVar39 = iVar39 + 1;
                      }
                    }
                    iVar33 = iVar33 + uVar2;
                  }
                }
              }
            }
            else if (uVar30 == 1) {
              lVar44 = (bx.smallend.vect[1] - iVar39) * lVar44;
              for (uVar38 = 0; uVar38 != uVar49; uVar38 = uVar38 + 1) {
                for (lVar20 = (long)bx.smallend.vect[2]; lVar20 <= bx.bigend.vect[2];
                    lVar20 = lVar20 + 1) {
                  lVar46 = (lVar20 - iVar22) * lVar28;
                  iVar33 = bx.smallend.vect[0] * uVar2 - iVar4;
                  for (lVar26 = lVar35; lVar26 <= lVar37; lVar26 = lVar26 + 1) {
                    for (uVar50 = 0; uVar50 != uVar24; uVar50 = uVar50 + 1) {
                      uVar32 = uVar23;
                      iVar39 = iVar33;
                      while (bVar15 = uVar32 != 0, uVar32 = uVar32 - 1, bVar15) {
                        pdVar10[lVar44 + lVar45 * uVar38 + lVar46 + (lVar26 - lVar43)] =
                             pdVar10[lVar44 + lVar45 * uVar38 + lVar46 + (lVar26 - lVar43)] -
                             pdVar11[(int)((bx.smallend.vect[1] + 1) * uVar3 - iVar5) * lVar41 +
                                     lVar40 * uVar38 +
                                     (int)((int)uVar50 + (local_318 * (int)lVar20 - iVar6)) * lVar27
                                     + (long)iVar39] * dVar12;
                        iVar39 = iVar39 + 1;
                      }
                    }
                    iVar33 = iVar33 + uVar2;
                  }
                }
              }
            }
            else {
              lVar28 = lVar28 * (bx.smallend.vect[2] - iVar22);
              for (uVar38 = 0; uVar38 != uVar49; uVar38 = uVar38 + 1) {
                for (lVar42 = lVar20; lVar42 <= lVar26; lVar42 = lVar42 + 1) {
                  lVar29 = (lVar42 - lVar46) * lVar44;
                  iVar33 = uVar2 * bx.smallend.vect[0] - iVar4;
                  for (lVar36 = lVar35; lVar36 <= lVar37; lVar36 = lVar36 + 1) {
                    for (uVar50 = 0; uVar50 != uVar47; uVar50 = uVar50 + 1) {
                      uVar32 = uVar23;
                      iVar39 = iVar33;
                      while (bVar15 = uVar32 != 0, uVar32 = uVar32 - 1, bVar15) {
                        pdVar10[lVar28 + lVar45 * uVar38 + lVar29 + (lVar36 - lVar43)] =
                             pdVar11[lVar27 * (int)(bx.smallend.vect[2] * local_318 - iVar6) +
                                     lVar40 * uVar38 +
                                     (int)((int)uVar50 + (uVar3 * (int)lVar42 - iVar5)) * lVar41 +
                                     (long)iVar39] * dVar12 +
                             pdVar10[lVar28 + lVar45 * uVar38 + lVar29 + (lVar36 - lVar43)];
                        iVar39 = iVar39 + 1;
                      }
                    }
                    iVar33 = iVar33 + uVar2;
                  }
                }
              }
            }
          }
        }
      }
      bx.bigend.vect[1] = iStack_1c8;
      bx.bigend.vect[2] = iVar17;
      bx.smallend.vect[0] = hi.vect[0];
      bx.smallend.vect[1] = hi.vect[1];
      bx.smallend.vect[2] = hi.vect[2];
      bx.bigend.vect[0] = iStack_1cc;
      bx.btype.itype = uVar21;
      Box::operator&=(&bx,rhs);
      if (bx.smallend.vect[0] <= bx.bigend.vect[0]) {
        if (bx.smallend.vect[1] <= bx.bigend.vect[1]) {
          if ((bx.smallend.vect[2] <= bx.bigend.vect[2]) && (bx.btype.itype < 8)) {
            pdVar10 = (pFVar9->super_BaseFab<double>).dptr;
            iVar33 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[0];
            iVar39 = *(int *)((long)&(pFVar9->super_BaseFab<double>).domain + 4);
            iVar22 = *(int *)((long)&(pFVar9->super_BaseFab<double>).domain + 8);
            lVar44 = (long)((((IntVect *)((long)&(pFVar9->super_BaseFab<double>).domain + 0xc))->
                             vect[0] - iVar33) + 1);
            lVar20 = ((*(int *)((long)&(pFVar9->super_BaseFab<double>).domain + 0x10) - iVar39) + 1)
                     * lVar44;
            lVar35 = ((*(int *)((long)&(pFVar9->super_BaseFab<double>).domain + 0x14) - iVar22) + 1)
                     * lVar20;
            dVar12 = *(double *)(local_148 + uVar31 * 8);
            pdVar11 = (pFVar8->super_BaseFab<double>).dptr;
            iVar4 = (pFVar8->super_BaseFab<double>).domain.smallend.vect[0];
            iVar5 = (pFVar8->super_BaseFab<double>).domain.smallend.vect[1];
            iVar6 = (pFVar8->super_BaseFab<double>).domain.smallend.vect[2];
            lVar37 = (long)(((pFVar8->super_BaseFab<double>).domain.bigend.vect[0] - iVar4) + 1);
            lVar45 = (((pFVar8->super_BaseFab<double>).domain.bigend.vect[1] - iVar5) + 1) * lVar37;
            lVar26 = (((pFVar8->super_BaseFab<double>).domain.bigend.vect[2] - iVar6) + 1) * lVar45;
            if (uVar30 * 2 == 2) {
              lVar44 = (bx.smallend.vect[1] - iVar39) * lVar44;
              for (uVar38 = 0; uVar38 != uVar49; uVar38 = uVar38 + 1) {
                for (lVar41 = (long)bx.smallend.vect[2]; lVar41 <= bx.bigend.vect[2];
                    lVar41 = lVar41 + 1) {
                  lVar27 = (lVar41 - iVar22) * lVar20;
                  iVar39 = uVar2 * bx.smallend.vect[0] - iVar4;
                  for (lVar28 = (long)bx.smallend.vect[0]; lVar28 <= bx.bigend.vect[0];
                      lVar28 = lVar28 + 1) {
                    lVar46 = lVar28 - iVar33;
                    for (uVar50 = 0; uVar50 != uVar24; uVar50 = uVar50 + 1) {
                      uVar32 = uVar23;
                      iVar34 = iVar39;
                      while (bVar15 = uVar32 != 0, uVar32 = uVar32 - 1, bVar15) {
                        pdVar10[lVar44 + lVar35 * uVar38 + lVar27 + lVar46] =
                             pdVar11[(int)(bx.smallend.vect[1] * uVar3 - iVar5) * lVar37 +
                                     lVar26 * uVar38 +
                                     (int)((int)uVar50 + (local_318 * (int)lVar41 - iVar6)) * lVar45
                                     + (long)iVar34] * dVar12 +
                             pdVar10[lVar44 + lVar35 * uVar38 + lVar27 + lVar46];
                        iVar34 = iVar34 + 1;
                      }
                    }
                    iVar39 = iVar39 + uVar2;
                  }
                }
              }
            }
            else if (uVar30 * 2 == 0) {
              for (uVar38 = 0; uVar38 != uVar49; uVar38 = uVar38 + 1) {
                for (lVar41 = (long)bx.smallend.vect[2]; lVar41 <= bx.bigend.vect[2];
                    lVar41 = lVar41 + 1) {
                  lVar27 = (lVar41 - iVar22) * lVar20;
                  iVar34 = uVar3 * bx.smallend.vect[1] - iVar5;
                  for (lVar28 = (long)bx.smallend.vect[1]; lVar28 <= bx.bigend.vect[1];
                      lVar28 = lVar28 + 1) {
                    lVar46 = (lVar28 - iVar39) * lVar44;
                    for (uVar50 = 0; uVar50 != uVar24; uVar50 = uVar50 + 1) {
                      uVar32 = uVar47;
                      iVar48 = iVar34;
                      while (bVar15 = uVar32 != 0, uVar32 = uVar32 - 1, bVar15) {
                        pdVar10[(long)(bx.smallend.vect[0] - iVar33) +
                                lVar35 * uVar38 + lVar27 + lVar46] =
                             pdVar11[(long)(int)(bx.smallend.vect[0] * uVar2 - iVar4) +
                                     lVar26 * uVar38 +
                                     (int)((local_318 * (int)lVar41 - iVar6) + (int)uVar50) * lVar45
                                     + iVar48 * lVar37] * dVar12 +
                             pdVar10[(long)(bx.smallend.vect[0] - iVar33) +
                                     lVar35 * uVar38 + lVar27 + lVar46];
                        iVar48 = iVar48 + 1;
                      }
                    }
                    iVar34 = iVar34 + uVar3;
                  }
                }
              }
            }
            else {
              lVar20 = lVar20 * (bx.smallend.vect[2] - iVar22);
              for (uVar38 = 0; uVar38 != uVar49; uVar38 = uVar38 + 1) {
                for (lVar41 = (long)bx.smallend.vect[1]; lVar41 <= bx.bigend.vect[1];
                    lVar41 = lVar41 + 1) {
                  lVar27 = (lVar41 - iVar39) * lVar44;
                  iVar22 = uVar2 * bx.smallend.vect[0] - iVar4;
                  for (lVar28 = (long)bx.smallend.vect[0]; lVar28 <= bx.bigend.vect[0];
                      lVar28 = lVar28 + 1) {
                    lVar46 = lVar28 - iVar33;
                    for (uVar50 = 0; uVar50 != uVar47; uVar50 = uVar50 + 1) {
                      uVar32 = uVar23;
                      iVar34 = iVar22;
                      while (bVar15 = uVar32 != 0, uVar32 = uVar32 - 1, bVar15) {
                        pdVar10[lVar20 + lVar35 * uVar38 + lVar27 + lVar46] =
                             pdVar11[lVar45 * (int)(bx.smallend.vect[2] * local_318 - iVar6) +
                                     lVar26 * uVar38 +
                                     (int)((int)uVar50 + (uVar3 * (int)lVar41 - iVar5)) * lVar37 +
                                     (long)iVar34] * dVar12 +
                             pdVar10[lVar20 + lVar35 * uVar38 + lVar27 + lVar46];
                        iVar34 = iVar34 + 1;
                      }
                    }
                    iVar22 = iVar22 + uVar2;
                  }
                }
              }
            }
          }
        }
      }
      ppFVar25 = local_180 + 1;
    }
  }
  std::array<amrex::FArrayBox,_3UL>::~array(&ftmp);
  return;
}

Assistant:

void
YAFluxRegister::FineAdd (const MFIter& mfi,
                         const std::array<FArrayBox const*, AMREX_SPACEDIM>& a_flux,
                         const Real* dx, Real dt, RunOn runon) noexcept
{
    BL_ASSERT(m_cfpatch.nComp() == a_flux[0]->nComp());

    const int li = mfi.LocalIndex();
    Vector<FArrayBox*>& cfp_fabs = m_cfp_fab[li];
    if (cfp_fabs.empty()) return;

    const Box& tbx = mfi.tilebox();
    const Box& bx = amrex::coarsen(tbx, m_ratio);
    const Box& fbx = amrex::refine(bx, m_ratio);
    const int nc = m_cfpatch.nComp();

    const Real ratio = static_cast<Real>(AMREX_D_TERM(m_ratio[0],*m_ratio[1],*m_ratio[2]));
    std::array<Real,AMREX_SPACEDIM> dtdx{{AMREX_D_DECL(dt/(dx[0]*ratio),
                                                       dt/(dx[1]*ratio),
                                                       dt/(dx[2]*ratio))}};
    const Dim3 rr = m_ratio.dim3();

    std::array<FArrayBox const*,AMREX_SPACEDIM> flux{{AMREX_D_DECL(a_flux[0],a_flux[1],a_flux[2])}};
    bool use_gpu = (runon == RunOn::Gpu) && Gpu::inLaunchRegion();
    amrex::ignore_unused(use_gpu);
    std::array<FArrayBox,AMREX_SPACEDIM> ftmp;
    if (fbx != tbx) {
        AMREX_ASSERT(!use_gpu);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            const Box& b = amrex::surroundingNodes(fbx,idim);
            ftmp[idim].resize(b,nc);
            ftmp[idim].setVal<RunOn::Host>(0.0);
            ftmp[idim].copy<RunOn::Host>(*a_flux[idim]);
            flux[idim] = &ftmp[idim];
        }
    }

    AMREX_ASSERT(bx.cellCentered());

    for (int idim=0; idim < AMREX_SPACEDIM; ++idim)
    {
        const Box& lobx = amrex::adjCellLo(bx, idim);
        const Box& hibx = amrex::adjCellHi(bx, idim);
        FArrayBox const* f = flux[idim];
        for (FArrayBox* cfp : cfp_fabs)
        {
            {
                const Box& lobx_is = lobx & cfp->box();
                const int side = 0;
                if (lobx_is.ok())
                {
                    auto d = cfp->array();
                    Real dtdxs = dtdx[idim];
                    int dirside = idim*2+side;
                    Array4<Real const> farr = f->const_array();
                    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_FLAG(runon, lobx_is, tmpbox,
                    {
                        yafluxreg_fineadd(tmpbox, d, farr, dtdxs, nc, dirside, rr);
                    });
                }
            }
            {
                const Box& hibx_is = hibx & cfp->box();
                const int side = 1;
                if (hibx_is.ok())
                {
                    auto d = cfp->array();
                    Real dtdxs = dtdx[idim];
                    int dirside = idim*2+side;
                    Array4<Real const> farr = f->const_array();
                    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_FLAG(runon, hibx_is, tmpbox,
                    {
                        yafluxreg_fineadd(tmpbox, d, farr, dtdxs, nc, dirside, rr);
                    });
                }
            }
        }
    }
}